

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O1

bool __thiscall
HighsPrimalHeuristics::solveSubMip
          (HighsPrimalHeuristics *this,HighsLp *lp,HighsBasis *basis,double fixingRate,
          vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt maxleaves,HighsInt maxnodes,
          HighsInt stallnodes)

{
  pointer pdVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  HighsMipSolver *pHVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  long lVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  HighsMipSolver submipsolver;
  HighsOptions submipoptions;
  HighsPseudocostInitialization pscostinit;
  HighsSolution local_b38;
  undefined1 local_ad0 [32];
  HighsModelStatus local_ab0;
  vector<double,_std::allocator<double>_> local_aa8 [3];
  long local_a58;
  int local_a18;
  HighsBasis *local_a10;
  HighsPseudocostInitialization *local_a08;
  HighsCliqueTable *local_a00;
  HighsImplications *local_9f8;
  _Head_base<0UL,_HighsMipSolverData_*,_false> local_9f0;
  undefined1 local_8e0 [136];
  double local_858;
  double local_7a0;
  bool local_708;
  bool local_5e6;
  HighsInt local_5e4;
  HighsInt local_5e0;
  HighsInt local_5d8;
  HighsInt local_5c4;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  HighsLp local_4e0;
  HighsPseudocostInitialization local_148;
  
  HighsOptions::HighsOptions((HighsOptions *)local_8e0,this->mipsolver->options_mip_);
  HighsLp::HighsLp(&local_4e0,lp);
  pdVar6 = local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar11 = local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0;
  local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = pdVar4;
  local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar5;
  local_4e0.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar1;
  if (bVar11) {
    operator_delete(pdVar6);
  }
  pdVar6 = local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar11 = local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0;
  local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = pdVar4;
  local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar5;
  local_4e0.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar1;
  if (bVar11) {
    operator_delete(pdVar6);
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=
            (&local_4e0.integrality_,&this->mipsolver->model_->integrality_);
  local_4e0.offset_ = 0.0;
  local_708 = false;
  __buf = extraout_RDX;
  local_5d8 = maxleaves;
  if ((lp->num_col_ == -0x36) && (lp->num_row_ == -0xac)) {
    local_708 = true;
    highsBoolToString_abi_cxx11_((string *)local_ad0,true,2);
    printf("HighsPrimalHeuristics::solveSubMip (%d, %d) with output_flag = %s\n",0xffffffca,
           0xffffff54,local_ad0._0_8_);
    __buf = extraout_RDX_00;
    if ((undefined1 *)local_ad0._0_8_ != local_ad0 + 0x10) {
      operator_delete((void *)local_ad0._0_8_);
      __buf = extraout_RDX_01;
    }
  }
  local_5e4 = maxnodes;
  local_5e0 = stallnodes;
  local_5c4 = 0;
  HighsTimer::read(&this->mipsolver->timer_,0,__buf,(ulong)(uint)maxnodes);
  local_858 = local_858 - extraout_XMM0_Qa;
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_7a0 = (_Var2._M_head_impl)->upper_limit;
  if (this->mipsolver->submip == false) {
    dVar14 = (_Var2._M_head_impl)->lower_bound;
    dVar12 = local_7a0 - dVar14;
    if (INFINITY <= dVar12) {
      if (ABS(dVar14) == INFINITY) {
        dVar12 = 0.0;
      }
      else {
        dVar12 = ABS(dVar14);
      }
    }
    local_5b0 = 0.0;
    local_5a8 = 1000.0;
    if (1000.0 <= dVar12) {
      local_5a8 = dVar12;
    }
    local_5a8 = local_5a8 * (_Var2._M_head_impl)->feastol;
  }
  std::__cxx11::string::_M_assign((string *)(local_8e0 + 8));
  local_5e6 = false;
  local_5a0 = 0.8;
  local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.value_valid = false;
  local_b38.dual_valid = false;
  if (this->mipsolver->submip == false) {
    HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x3c);
  }
  HighsMipSolver::HighsMipSolver
            ((HighsMipSolver *)local_ad0,this->mipsolver->callback_,(HighsOptions *)local_8e0,
             &local_4e0,&local_b38,true,this->mipsolver->submip_level + 1);
  local_a10 = basis;
  HighsPseudocostInitialization::HighsPseudocostInitialization
            (&local_148,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost,1);
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_a00 = &(_Var2._M_head_impl)->cliquetable;
  local_9f8 = &(_Var2._M_head_impl)->implications;
  local_a08 = &local_148;
  HighsMipSolver::run((HighsMipSolver *)local_ad0);
  pHVar3 = this->mipsolver;
  iVar7 = local_a18 + 1;
  if (local_a18 + 1 <= pHVar3->max_submip_level) {
    iVar7 = pHVar3->max_submip_level;
  }
  pHVar3->max_submip_level = iVar7;
  if (pHVar3->submip == false) {
    HighsMipAnalysis::mipTimerStop(&pHVar3->analysis_,0x3c);
  }
  if ((_Head_base<0UL,_HighsMipSolverData_*,_false>)local_9f0._M_head_impl !=
      (_Head_base<0UL,_HighsMipSolverData_*,_false>)0x0) {
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar10 = ((long)*(pointer *)((long)&(_Var2._M_head_impl)->continuous_cols + 8) -
              *(long *)&((_Var2._M_head_impl)->continuous_cols).
                        super__Vector_base<int,_std::allocator<int>_> >> 2) +
             ((long)*(pointer *)((long)&(_Var2._M_head_impl)->integral_cols + 8) -
              *(long *)&((_Var2._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_> >> 2);
    auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = 0x45300000;
    dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
    iVar7 = *(int *)local_ad0._16_8_;
    if (dVar14 <= 1.0) {
      dVar14 = 1.0;
    }
    dVar12 = (double)(local_9f0._M_head_impl)->total_lp_iterations * ((double)iVar7 / dVar14);
    uVar9 = (ulong)dVar12;
    this->lp_iterations =
         this->lp_iterations +
         ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
    lVar10 = (local_9f0._M_head_impl)->total_repair_lp_feasible;
    this->total_repair_lp = this->total_repair_lp + (local_9f0._M_head_impl)->total_repair_lp;
    this->total_repair_lp_feasible = this->total_repair_lp_feasible + lVar10;
    this->total_repair_lp_iterations =
         this->total_repair_lp_iterations + (local_9f0._M_head_impl)->total_repair_lp_iterations;
    if (this->mipsolver->submip == true) {
      lVar8 = (long)(((double)iVar7 / dVar14) * (double)local_a58);
      lVar10 = 1;
      if (1 < lVar8) {
        lVar10 = lVar8;
      }
      (_Var2._M_head_impl)->num_nodes = (_Var2._M_head_impl)->num_nodes + lVar10;
    }
  }
  if (local_ab0 == kInfeasible) {
    this->infeasObservations = this->infeasObservations + fixingRate;
    this->numInfeasObservations = this->numInfeasObservations + 1;
  }
  if (local_ab0 != kInfeasible || 1 < local_a58) {
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    iVar7 = (_Var2._M_head_impl)->numImprovingSols;
    if ((local_ab0 != kInfeasible) &&
       (local_aa8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_aa8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      HighsMipSolverData::trySolution(_Var2._M_head_impl,local_aa8,4);
    }
    if (((this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numImprovingSols != iVar7
       ) {
      this->successObservations = fixingRate + this->successObservations;
      this->numSuccessObservations = this->numSuccessObservations + 1;
    }
  }
  HighsPseudocostInitialization::~HighsPseudocostInitialization(&local_148);
  HighsMipSolver::~HighsMipSolver((HighsMipSolver *)local_ad0);
  if (local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsLp::~HighsLp(&local_4e0);
  HighsOptions::~HighsOptions((HighsOptions *)local_8e0);
  return local_ab0 != kInfeasible || 1 < local_a58;
}

Assistant:

bool HighsPrimalHeuristics::solveSubMip(
    const HighsLp& lp, const HighsBasis& basis, double fixingRate,
    std::vector<double> colLower, std::vector<double> colUpper,
    HighsInt maxleaves, HighsInt maxnodes, HighsInt stallnodes) {
  HighsOptions submipoptions = *mipsolver.options_mip_;
  HighsLp submip = lp;

  // set bounds and restore integrality of the lp relaxation copy
  submip.col_lower_ = std::move(colLower);
  submip.col_upper_ = std::move(colUpper);
  submip.integrality_ = mipsolver.model_->integrality_;
  submip.offset_ = 0;

  // set limits
  submipoptions.mip_max_leaves = maxleaves;
  submipoptions.output_flag = false;

  const bool allow_submip_log = true;
  if (allow_submip_log && lp.num_col_ == -54 && lp.num_row_ == -172) {
    submipoptions.output_flag = true;
    printf(
        "HighsPrimalHeuristics::solveSubMip (%d, %d) with output_flag = %s\n",
        int(lp.num_col_), int(lp.num_row_),
        highsBoolToString(submipoptions.output_flag).c_str());
  }

  submipoptions.mip_max_nodes = maxnodes;
  submipoptions.mip_max_stall_nodes = stallnodes;
  submipoptions.mip_pscost_minreliable = 0;
  submipoptions.time_limit -= mipsolver.timer_.read();
  submipoptions.objective_bound = mipsolver.mipdata_->upper_limit;

  if (!mipsolver.submip) {
    double curr_abs_gap =
        mipsolver.mipdata_->upper_limit - mipsolver.mipdata_->lower_bound;

    if (curr_abs_gap == kHighsInf) {
      curr_abs_gap = fabs(mipsolver.mipdata_->lower_bound);
      if (curr_abs_gap == kHighsInf) curr_abs_gap = 0.0;
    }

    submipoptions.mip_rel_gap = 0.0;
    submipoptions.mip_abs_gap =
        mipsolver.mipdata_->feastol * std::max(curr_abs_gap, 1000.0);
  }

  // check if only root presolve is allowed
  if (submipoptions.mip_root_presolve_only)
    submipoptions.presolve = kHighsOffString;
  else
    submipoptions.presolve = kHighsOnString;
  submipoptions.mip_detect_symmetry = false;
  submipoptions.mip_heuristic_effort = 0.8;
  // setup solver and run it

  HighsSolution solution;
  solution.value_valid = false;
  solution.dual_valid = false;
  // Create HighsMipSolver instance for sub-MIP
  if (!mipsolver.submip)
    mipsolver.analysis_.mipTimerStart(kMipClockSubMipSolve);
  HighsMipSolver submipsolver(*mipsolver.callback_, submipoptions, submip,
                              solution, true, mipsolver.submip_level + 1);
  submipsolver.rootbasis = &basis;
  HighsPseudocostInitialization pscostinit(mipsolver.mipdata_->pseudocost, 1);
  submipsolver.pscostinit = &pscostinit;
  submipsolver.clqtableinit = &mipsolver.mipdata_->cliquetable;
  submipsolver.implicinit = &mipsolver.mipdata_->implications;
  // Solve the sub-MIP
  submipsolver.run();
  mipsolver.max_submip_level =
      std::max(submipsolver.max_submip_level + 1, mipsolver.max_submip_level);
  if (!mipsolver.submip) mipsolver.analysis_.mipTimerStop(kMipClockSubMipSolve);
  if (submipsolver.mipdata_) {
    double numUnfixed = mipsolver.mipdata_->integral_cols.size() +
                        mipsolver.mipdata_->continuous_cols.size();
    double adjustmentfactor = submipsolver.numCol() / std::max(1.0, numUnfixed);
    // (double)mipsolver.orig_model_->a_matrix_.value_.size();
    int64_t adjusted_lp_iterations =
        (size_t)(adjustmentfactor * submipsolver.mipdata_->total_lp_iterations);
    lp_iterations += adjusted_lp_iterations;
    total_repair_lp += submipsolver.mipdata_->total_repair_lp;
    total_repair_lp_feasible += submipsolver.mipdata_->total_repair_lp_feasible;
    total_repair_lp_iterations +=
        submipsolver.mipdata_->total_repair_lp_iterations;
    if (mipsolver.submip)
      mipsolver.mipdata_->num_nodes += std::max(
          int64_t{1}, int64_t(adjustmentfactor * submipsolver.node_count_));
  }

  if (submipsolver.modelstatus_ == HighsModelStatus::kInfeasible) {
    infeasObservations += fixingRate;
    ++numInfeasObservations;
  }
  if (submipsolver.node_count_ <= 1 &&
      submipsolver.modelstatus_ == HighsModelStatus::kInfeasible)
    return false;
  HighsInt oldNumImprovingSols = mipsolver.mipdata_->numImprovingSols;
  if (submipsolver.modelstatus_ != HighsModelStatus::kInfeasible &&
      !submipsolver.solution_.empty()) {
    mipsolver.mipdata_->trySolution(submipsolver.solution_,
                                    kSolutionSourceSubMip);
  }

  if (mipsolver.mipdata_->numImprovingSols != oldNumImprovingSols) {
    // remember fixing rate as good
    successObservations += fixingRate;
    ++numSuccessObservations;
  }

  return true;
}